

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateVerbose_Test::~OsqpTest_GetAndUpdateVerbose_Test
          (OsqpTest_GetAndUpdateVerbose_Test *this)

{
  OsqpTest_GetAndUpdateVerbose_Test *this_local;
  
  ~OsqpTest_GetAndUpdateVerbose_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateVerbose) {
  OsqpSettings settings;
  settings.verbose = false;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto verbose = solver.GetVerbose();
    ASSERT_TRUE(verbose.ok());
    EXPECT_FALSE(*verbose);
  }

  ASSERT_TRUE(solver.UpdateVerbose(true).ok());
  {
    const auto verbose = solver.GetVerbose();
    ASSERT_TRUE(verbose.ok());
    EXPECT_TRUE(*verbose);
  }
}